

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O0

SyncPointVkPtr __thiscall Diligent::CommandQueueVkImpl::GetLastSyncPoint(CommandQueueVkImpl *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  SyncPointVkPtr SVar1;
  lock_guard<Threading::SpinLock> local_20;
  SpinLockGuard Guard;
  CommandQueueVkImpl *this_local;
  
  std::lock_guard<Threading::SpinLock>::lock_guard(&local_20,(mutex_type *)(in_RSI + 0x80));
  std::shared_ptr<Diligent::SyncPointVk>::shared_ptr
            ((shared_ptr<Diligent::SyncPointVk> *)this,
             (shared_ptr<Diligent::SyncPointVk> *)(in_RSI + 0x88));
  std::lock_guard<Threading::SpinLock>::~lock_guard(&local_20);
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SyncPointVkPtr)SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SyncPointVkPtr GetLastSyncPoint()
    {
        Threading::SpinLockGuard Guard{m_LastSyncPointLock};
        return m_LastSyncPoint;
    }